

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O2

int str_num_base(char **linep,curl_off_t *nump,curl_off_t max,int base)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  
  iVar4 = 0x37;
  if (base == 0x10) {
    iVar4 = 0x66;
  }
  iVar7 = 0x39;
  if (base != 10) {
    iVar7 = iVar4;
  }
  *nump = 0;
  cVar1 = **linep;
  uVar2 = (uint)cVar1;
  iVar4 = 8;
  if (((int)uVar2 <= iVar7 && 0x2f < (int)uVar2) &&
     ((0x1ffffff81fc00U >> ((ulong)(byte)(cVar1 - 0x30) & 0x3f) & 1) == 0)) {
    uVar6 = (ulong)(uint)base;
    pcVar5 = *linep + 1;
    lVar3 = 0;
    if (max < (long)uVar6) {
      do {
        pcVar8 = pcVar5;
        lVar3 = lVar3 * uVar6 + (ulong)((byte)(&DAT_0017c890)[uVar2 & 0xff] & 0xf);
        if (max < lVar3) {
          return 7;
        }
        uVar2 = (uint)*pcVar8;
      } while (((0x2f < (int)uVar2) && ((int)uVar2 <= iVar7)) &&
              (pcVar5 = pcVar8 + 1,
              (0x1ffffff81fc00U >> ((ulong)(byte)(*pcVar8 - 0x30) & 0x3f) & 1) == 0));
    }
    else {
      do {
        pcVar8 = pcVar5;
        if ((long)(max - (ulong)((byte)(&DAT_0017c890)[uVar2 & 0xff] & 0xf)) / (long)uVar6 < lVar3)
        {
          return 7;
        }
        lVar3 = lVar3 * uVar6 + (ulong)((byte)(&DAT_0017c890)[uVar2 & 0xff] & 0xf);
        uVar2 = (uint)*pcVar8;
      } while (((0x2f < (int)uVar2) && ((int)uVar2 <= iVar7)) &&
              (pcVar5 = pcVar8 + 1,
              (0x1ffffff81fc00U >> ((ulong)(byte)(*pcVar8 - 0x30) & 0x3f) & 1) == 0));
    }
    *nump = lVar3;
    *linep = pcVar8;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int str_num_base(const char **linep, curl_off_t *nump, curl_off_t max,
                        int base) /* 8, 10 or 16, nothing else */
{
  curl_off_t num = 0;
  const char *p;
  int m = (base == 10) ? '9' :   /* the largest digit possible */
    (base == 16) ? 'f' : '7';
  DEBUGASSERT(linep && *linep && nump);
  DEBUGASSERT((base == 8) || (base == 10) || (base == 16));
  DEBUGASSERT(max >= 0); /* mostly to catch SIZE_T_MAX, which is too large */
  *nump = 0;
  p = *linep;
  if(!valid_digit(*p, m))
    return STRE_NO_NUM;
  if(max < base) {
    /* special-case low max scenario because check needs to be different */
    do {
      int n = Curl_hexval(*p++);
      num = num * base + n;
      if(num > max)
        return STRE_OVERFLOW;
    } while(valid_digit(*p, m));
  }
  else {
    do {
      int n = Curl_hexval(*p++);
      if(num > ((max - n) / base))
        return STRE_OVERFLOW;
      num = num * base + n;
    } while(valid_digit(*p, m));
  }
  *nump = num;
  *linep = p;
  return STRE_OK;
}